

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O0

void __thiscall
QtMWidgets::NavigationArrow::NavigationArrow
          (NavigationArrow *this,Direction direction,QWidget *parent)

{
  NavigationArrowPrivate *this_00;
  NavigationArrowPrivate *this_01;
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *parent_local;
  NavigationArrow *pNStack_10;
  Direction direction_local;
  NavigationArrow *this_local;
  
  local_20 = parent;
  parent_local._4_4_ = direction;
  pNStack_10 = this;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_24.i);
  *(undefined ***)this = &PTR_metaObject_002329a8;
  *(undefined ***)&this->field_0x10 = &PTR__NavigationArrow_00232b58;
  this_00 = (NavigationArrowPrivate *)operator_new(0x40);
  NavigationArrowPrivate::NavigationArrowPrivate(this_00,parent_local._4_4_,this);
  QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
            ::operator->(&this->d);
  NavigationArrowPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

NavigationArrow::NavigationArrow( Direction direction, QWidget * parent )
	:	QWidget( parent )
	,	d( new NavigationArrowPrivate( direction, this ) )
{
	d->init();
}